

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

bool __thiscall cfd::core::KeyFormatData::LoadCache(KeyFormatData *this)

{
  bool bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  pointer ppVar5;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  bool local_471;
  bool local_3f1;
  bool local_371;
  reference local_328;
  allocator local_311;
  key_type local_310;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  allocator local_2e1;
  key_type local_2e0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  _Self local_2b8;
  byte local_2ab;
  byte local_2aa;
  allocator local_2a9;
  key_type local_2a8;
  _Self local_288;
  _Self local_280;
  allocator local_271;
  key_type local_270;
  _Self local_250;
  reference local_248;
  allocator local_231;
  key_type local_230;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  allocator local_201;
  key_type local_200;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  _Self local_1d8;
  byte local_1cb;
  byte local_1ca;
  allocator local_1c9;
  key_type local_1c8;
  _Self local_1a8;
  _Self local_1a0;
  allocator local_191;
  key_type local_190;
  _Self local_170;
  reference local_168;
  allocator local_151;
  key_type local_150;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  allocator local_121;
  key_type local_120;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  allocator local_f1;
  key_type local_f0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  ByteData local_c8;
  allocator local_a9;
  key_type local_a8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  StringUtil local_80 [8];
  string flag_str;
  allocator local_41;
  key_type local_40;
  _Self local_20;
  KeyFormatData *local_18;
  KeyFormatData *this_local;
  
  local_18 = this;
  bVar1 = IsValid(this);
  if (bVar1) {
    ::std::vector<bool,_std::allocator<bool>_>::clear(&this->has_format_);
    ::std::vector<bool,_std::allocator<bool>_>::resize(&this->has_format_,3,false);
    this->is_mainnet = false;
    this->wif_prefix_ = '\0';
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_40,"IsMainnet",&local_41);
    local_20._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->map_,&local_40);
    flag_str.field_2._8_8_ =
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->map_);
    bVar1 = ::std::operator!=(&local_20,(_Self *)((long)&flag_str.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a8,"IsMainnet",&local_a9);
      local_88._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->map_,&local_a8);
      ppVar5 = ::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_88);
      StringUtil::ToLower(local_80,(string *)&ppVar5->second);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      bVar2 = ::std::__cxx11::string::empty();
      local_371 = true;
      if ((bVar2 & 1) == 0) {
        local_371 = ::std::operator==(in_stack_fffffffffffffb30,
                                      (char *)CONCAT44(in_stack_fffffffffffffb2c,
                                                       in_stack_fffffffffffffb28));
      }
      this->is_mainnet = local_371;
      ::std::__cxx11::string::~string((string *)local_80);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_f0,"wif",&local_f1);
    local_d0._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->map_,&local_f0);
    ppVar5 = ::std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_d0);
    ByteData::ByteData(&local_c8,&ppVar5->second);
    uVar3 = ByteData::GetHeadData(&local_c8);
    this->wif_prefix_ = uVar3;
    ByteData::~ByteData((ByteData *)0x46c47d);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_120,"bip32xpub",&local_121);
    local_100._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->map_,&local_120);
    ppVar5 = ::std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_100);
    uVar4 = LoadCache::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&LoadCache()::func,&ppVar5->second);
    (this->bip32_).pubkey_version = uVar4;
    ::std::__cxx11::string::~string((string *)&local_120);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_121);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_150,"bip32xprv",&local_151);
    local_130._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->map_,&local_150);
    ppVar5 = ::std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_130);
    uVar4 = LoadCache::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&LoadCache()::func,&ppVar5->second);
    (this->bip32_).privkey_version = uVar4;
    ::std::__cxx11::string::~string((string *)&local_150);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_151);
    local_168 = ::std::vector<bool,_std::allocator<bool>_>::at(&this->has_format_,0);
    std::_Bit_reference::operator=((_Bit_reference *)&local_168,true);
    ::std::allocator<char>::allocator();
    local_1ca = 0;
    local_1cb = 0;
    ::std::__cxx11::string::string((string *)&local_190,"bip49ypub",&local_191);
    local_170._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->map_,&local_190);
    local_1a0._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->map_);
    bVar1 = ::std::operator!=(&local_170,&local_1a0);
    local_3f1 = false;
    if (bVar1) {
      ::std::allocator<char>::allocator();
      local_1ca = 1;
      ::std::__cxx11::string::string((string *)&local_1c8,"bip49yprv",&local_1c9);
      local_1cb = 1;
      local_1a8._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->map_,&local_1c8);
      local_1d8._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->map_);
      local_3f1 = ::std::operator!=(&local_1a8,&local_1d8);
    }
    if ((local_1cb & 1) != 0) {
      ::std::__cxx11::string::~string((string *)&local_1c8);
    }
    if ((local_1ca & 1) != 0) {
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    }
    ::std::__cxx11::string::~string((string *)&local_190);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_191);
    if (local_3f1 != false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_200,"bip49ypub",&local_201);
      local_1e0._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->map_,&local_200);
      ppVar5 = ::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_1e0);
      uVar4 = LoadCache::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&LoadCache()::func,&ppVar5->second);
      (this->bip49_).pubkey_version = uVar4;
      ::std::__cxx11::string::~string((string *)&local_200);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_201);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_230,"bip49yprv",&local_231);
      local_210._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->map_,&local_230);
      ppVar5 = ::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_210);
      uVar4 = LoadCache::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&LoadCache()::func,&ppVar5->second);
      (this->bip49_).privkey_version = uVar4;
      ::std::__cxx11::string::~string((string *)&local_230);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
      local_248 = ::std::vector<bool,_std::allocator<bool>_>::at(&this->has_format_,1);
      std::_Bit_reference::operator=((_Bit_reference *)&local_248,true);
    }
    ::std::allocator<char>::allocator();
    local_2aa = 0;
    local_2ab = 0;
    ::std::__cxx11::string::string((string *)&local_270,"bip84zpub",&local_271);
    local_250._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->map_,&local_270);
    local_280._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->map_);
    bVar1 = ::std::operator!=(&local_250,&local_280);
    local_471 = false;
    if (bVar1) {
      ::std::allocator<char>::allocator();
      local_2aa = 1;
      ::std::__cxx11::string::string((string *)&local_2a8,"bip84zprv",&local_2a9);
      local_2ab = 1;
      local_288._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->map_,&local_2a8);
      local_2b8._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->map_);
      local_471 = ::std::operator!=(&local_288,&local_2b8);
    }
    if ((local_2ab & 1) != 0) {
      ::std::__cxx11::string::~string((string *)&local_2a8);
    }
    if ((local_2aa & 1) != 0) {
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    }
    ::std::__cxx11::string::~string((string *)&local_270);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_271);
    if (local_471 != false) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_2e0,"bip84zpub",&local_2e1);
      local_2c0._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->map_,&local_2e0);
      ppVar5 = ::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_2c0);
      uVar4 = LoadCache::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&LoadCache()::func,&ppVar5->second);
      (this->bip84_).pubkey_version = uVar4;
      ::std::__cxx11::string::~string((string *)&local_2e0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_310,"bip84zprv",&local_311);
      local_2f0._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->map_,&local_310);
      ppVar5 = ::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_2f0);
      uVar4 = LoadCache::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&LoadCache()::func,&ppVar5->second);
      (this->bip84_).privkey_version = uVar4;
      ::std::__cxx11::string::~string((string *)&local_310);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_311);
      local_328 = ::std::vector<bool,_std::allocator<bool>_>::at(&this->has_format_,2);
      std::_Bit_reference::operator=((_Bit_reference *)&local_328,true);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool KeyFormatData::LoadCache() {
  static const auto func = [](const std::string &buf) -> uint32_t {
    if (buf.size() != 8) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid extkey version.");
    }
    Deserializer dec = Deserializer(ByteData(buf));
    return dec.ReadUint32FromBigEndian();
  };

  if (!IsValid()) return false;

  // reset value
  has_format_.clear();
  has_format_.resize(kFormatTypeListNum);
  is_mainnet = false;
  wif_prefix_ = 0;

  if (map_.find(kKeytypeIsMainnet) != map_.end()) {
    auto flag_str = StringUtil::ToLower(map_.find(kKeytypeIsMainnet)->second);
    is_mainnet = (flag_str.empty() || (flag_str == "true"));
  }
  wif_prefix_ = ByteData(map_.find(kWifPrefix)->second).GetHeadData();
  bip32_.pubkey_version = func(map_.find(kBip32Xpub)->second);
  bip32_.privkey_version = func(map_.find(kBip32Xprv)->second);
  has_format_.at(Bip32FormatType::kNormal) = true;
  if ((map_.find(kBip49Ypub) != map_.end()) &&
      (map_.find(kBip49Yprv) != map_.end())) {
    bip49_.pubkey_version = func(map_.find(kBip49Ypub)->second);
    bip49_.privkey_version = func(map_.find(kBip49Yprv)->second);
    has_format_.at(Bip32FormatType::kBip49) = true;
  }
  if ((map_.find(kBip84Zpub) != map_.end()) &&
      (map_.find(kBip84Zprv) != map_.end())) {
    bip84_.pubkey_version = func(map_.find(kBip84Zpub)->second);
    bip84_.privkey_version = func(map_.find(kBip84Zprv)->second);
    has_format_.at(Bip32FormatType::kBip84) = true;
  }
  return true;
}